

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O1

void __thiscall llvm::DWARFUnit::updateAddressDieMap(DWARFUnit *this,DWARFDie Die)

{
  map<unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>_>_>_>
  *this_00;
  ulong uVar1;
  ulong uVar2;
  _Rb_tree_node_base *p_Var3;
  unsigned_long uVar4;
  DWARFDebugInfoEntry *pDVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [8];
  bool bVar8;
  long lVar9;
  mapped_type *pmVar10;
  undefined8 uVar11;
  _Rb_tree_node_base *p_Var12;
  DWARFAddressRange *R;
  AlignedCharArrayUnion<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>
  __k;
  undefined1 auStack_90 [8];
  DWARFDie Die_local;
  Error local_78;
  DWARFUnit *pDStack_70;
  undefined1 local_68 [8];
  Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
  DIERangesOrError;
  anon_class_1_0_00000001 local_31;
  
  Die_local.U = (DWARFUnit *)Die.Die;
  auStack_90 = (undefined1  [8])Die.U;
  bVar8 = DWARFDie::isSubroutineDIE((DWARFDie *)auStack_90);
  if (bVar8) {
    DWARFDie::getAddressRanges
              ((Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
                *)local_68,(DWARFDie *)auStack_90);
    auVar7 = local_68;
    if ((DIERangesOrError.field_0.TStorage.buffer[0x10] & 1U) == 0) {
      if ((AlignedCharArrayUnion<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>
           )local_68 != DIERangesOrError.field_0.ErrorStorage.buffer) {
        this_00 = &this->AddrDieMap;
        DIERangesOrError._24_8_ = &(this->AddrDieMap)._M_t._M_impl.super__Rb_tree_header;
        Die_local.Die = (DWARFDebugInfoEntry *)DIERangesOrError.field_0.ErrorStorage.buffer;
        uVar11 = DIERangesOrError.field_0.ErrorStorage.buffer;
        __k.buffer = (char  [8])local_68;
        do {
          uVar1 = *(ulong *)__k.buffer;
          uVar2 = *(ulong *)((long)__k.buffer + 8);
          if (uVar1 != uVar2) {
            p_Var12 = (_Rb_tree_node_base *)DIERangesOrError._24_8_;
            for (p_Var3 = (this->AddrDieMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
                p_Var3 != (_Rb_tree_node_base *)0x0;
                p_Var3 = (&p_Var3->_M_left)[*(ulong *)(p_Var3 + 1) <= uVar1]) {
              if (*(ulong *)(p_Var3 + 1) > uVar1) {
                p_Var12 = p_Var3;
              }
            }
            if (p_Var12 != (this->AddrDieMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left)
            {
              lVar9 = std::_Rb_tree_decrement(p_Var12);
              if (uVar1 < *(ulong *)(lVar9 + 0x28)) {
                if (uVar2 < *(ulong *)(lVar9 + 0x28)) {
                  pmVar10 = std::
                            map<unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>_>_>_>
                            ::operator[](this_00,(key_type_conflict *)((long)__k.buffer + 8));
                  pmVar10->first = *(unsigned_long *)(lVar9 + 0x28);
                  pDVar5 = *(DWARFDebugInfoEntry **)(lVar9 + 0x38);
                  (pmVar10->second).U = *(DWARFUnit **)(lVar9 + 0x30);
                  (pmVar10->second).Die = pDVar5;
                }
                uVar1 = *(ulong *)__k.buffer;
                if (*(key_type_conflict *)(lVar9 + 0x20) < uVar1) {
                  pmVar10 = std::
                            map<unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>_>_>_>
                            ::operator[](this_00,(key_type_conflict *)(lVar9 + 0x20));
                  pmVar10->first = uVar1;
                }
              }
            }
            uVar4 = *(unsigned_long *)((long)__k.buffer + 8);
            local_78.Payload = (ErrorInfoBase *)auStack_90;
            pDStack_70 = Die_local.U;
            pmVar10 = std::
                      map<unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>_>_>_>
                      ::operator[](this_00,(key_type_conflict *)__k.buffer);
            pmVar10->first = uVar4;
            (pmVar10->second).U = (DWARFUnit *)local_78.Payload;
            (pmVar10->second).Die = (DWARFDebugInfoEntry *)pDStack_70;
            uVar11 = Die_local.Die;
          }
          __k.buffer = __k.buffer + 0x18;
        } while (__k.buffer != (char  [8])uVar11);
      }
    }
    else {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = DIERangesOrError.field_0.ErrorStorage.buffer;
      _local_68 = auVar6 << 0x40;
      local_78.Payload = (ErrorInfoBase *)((ulong)auVar7 | 1);
      handleAllErrors<llvm::consumeError(llvm::Error)::_lambda(llvm::ErrorInfoBase_const&)_1_>
                (&local_78,&local_31);
      if ((long *)((ulong)local_78.Payload & 0xfffffffffffffffe) != (long *)0x0) {
        (**(code **)(*(long *)((ulong)local_78.Payload & 0xfffffffffffffffe) + 8))();
      }
    }
    Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>::
    ~Expected((Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
               *)local_68);
  }
  _local_68 = (undefined1  [16])DWARFDie::getFirstChild((DWARFDie *)auStack_90);
  if (local_68._8_8_ != (DWARFDebugInfoEntry *)0x0 && local_68 != (DWARFUnit *)0x0) {
    do {
      updateAddressDieMap(this,(DWARFDie)_local_68);
      _local_68 = (undefined1  [16])DWARFDie::getSibling((DWARFDie *)local_68);
      if (local_68 == (DWARFUnit *)0x0) {
        return;
      }
    } while (local_68._8_8_ != (DWARFDebugInfoEntry *)0x0);
  }
  return;
}

Assistant:

void DWARFUnit::updateAddressDieMap(DWARFDie Die) {
  if (Die.isSubroutineDIE()) {
    auto DIERangesOrError = Die.getAddressRanges();
    if (DIERangesOrError) {
      for (const auto &R : DIERangesOrError.get()) {
        // Ignore 0-sized ranges.
        if (R.LowPC == R.HighPC)
          continue;
        auto B = AddrDieMap.upper_bound(R.LowPC);
        if (B != AddrDieMap.begin() && R.LowPC < (--B)->second.first) {
          // The range is a sub-range of existing ranges, we need to split the
          // existing range.
          if (R.HighPC < B->second.first)
            AddrDieMap[R.HighPC] = B->second;
          if (R.LowPC > B->first)
            AddrDieMap[B->first].first = R.LowPC;
        }
        AddrDieMap[R.LowPC] = std::make_pair(R.HighPC, Die);
      }
    } else
      llvm::consumeError(DIERangesOrError.takeError());
  }
  // Parent DIEs are added to the AddrDieMap prior to the Children DIEs to
  // simplify the logic to update AddrDieMap. The child's range will always
  // be equal or smaller than the parent's range. With this assumption, when
  // adding one range into the map, it will at most split a range into 3
  // sub-ranges.
  for (DWARFDie Child = Die.getFirstChild(); Child; Child = Child.getSibling())
    updateAddressDieMap(Child);
}